

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O2

void tcg_gen_sar_mod_i32(TCGContext_conflict9 *tcg_ctx,TCGv_i32 d,TCGv_i32 a,TCGv_i32 b)

{
  TCGv_i32 ret;
  uintptr_t o;
  
  ret = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_andi_i32_tricore(tcg_ctx,ret,b,0x1f);
  tcg_gen_sar_i32(tcg_ctx,d,a,ret);
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  return;
}

Assistant:

static void tcg_gen_sar_mod_i32(TCGContext *tcg_ctx, TCGv_i32 d, TCGv_i32 a, TCGv_i32 b)
{
    TCGv_i32 t = tcg_temp_new_i32(tcg_ctx);

    tcg_gen_andi_i32(tcg_ctx, t, b, 31);
    tcg_gen_sar_i32(tcg_ctx, d, a, t);
    tcg_temp_free_i32(tcg_ctx, t);
}